

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

opStatus __thiscall
llvm::detail::IEEEFloat::convert
          (IEEEFloat *this,fltSemantics *toSemantics,roundingMode rounding_mode,bool *losesInfo)

{
  short sVar1;
  fltSemantics *pfVar2;
  uint uVar3;
  lostFraction lost_fraction;
  opStatus oVar4;
  WordType *dst;
  Significand *pSVar5;
  uint uVar6;
  byte bVar7;
  uint n;
  uint Count;
  Significand SVar8;
  uint uVar9;
  bool bVar10;
  
  pfVar2 = this->semantics;
  uVar9 = toSemantics->precision;
  uVar6 = pfVar2->precision;
  Count = uVar9 - uVar6;
  if ((toSemantics == (fltSemantics *)semX87DoubleExtended ||
       pfVar2 != (fltSemantics *)semX87DoubleExtended) || ((this->field_0x12 & 7) != 1)) {
    bVar10 = false;
  }
  else {
    if (uVar6 - 0x40 < 0xffffff80) {
      pSVar5 = (Significand *)(this->significand).parts;
    }
    else {
      pSVar5 = &this->significand;
    }
    bVar10 = (uint)(pSVar5->part >> 0x3e) < 3;
  }
  n = uVar6 + 0x40 >> 6;
  if (((int)Count < 0) && ((this->field_0x12 & 7) != 3 && (this->field_0x12 & 6) != 0)) {
    if (uVar6 - 0x40 < 0xffffff80) {
      pSVar5 = (Significand *)(this->significand).parts;
    }
    else {
      pSVar5 = &this->significand;
    }
    uVar3 = APInt::tcMSB(&pSVar5->part,n);
    sVar1 = this->exponent;
    uVar6 = (int)toSemantics->minExponent - (int)sVar1;
    if ((int)toSemantics->minExponent <= (int)(sVar1 + 1 + (uVar3 - pfVar2->precision))) {
      uVar6 = (uVar3 - pfVar2->precision) + 1;
    }
    if ((int)uVar6 < 0) {
      if ((int)uVar6 <= (int)Count) {
        uVar6 = Count;
      }
      Count = Count - uVar6;
      this->exponent = sVar1 + (short)uVar6;
    }
  }
  uVar9 = uVar9 + 0x40 >> 6;
  lost_fraction = lfExactlyZero;
  if ((int)Count < 0) {
    bVar7 = this->field_0x12 & 7;
    if ((bVar7 == 1) || (lost_fraction = lfExactlyZero, (this->field_0x12 & 6) != 0 && bVar7 != 3))
    {
      if (this->semantics->precision - 0x40 < 0xffffff80) {
        pSVar5 = (Significand *)(this->significand).parts;
      }
      else {
        pSVar5 = &this->significand;
      }
      lost_fraction = lostFractionThroughTruncation(&pSVar5->part,n,-Count);
      APInt::tcShiftRight(&pSVar5->part,n,-Count);
    }
  }
  if (n < uVar9) {
    dst = (WordType *)operator_new__((ulong)(uVar9 * 8));
    APInt::tcSet(dst,0,uVar9);
    bVar7 = this->field_0x12 & 7;
    if ((bVar7 == 1) || ((this->field_0x12 & 6) != 0 && bVar7 != 3)) {
      if (this->semantics->precision - 0x40 < 0xffffff80) {
        pSVar5 = (Significand *)(this->significand).parts;
      }
      else {
        pSVar5 = &this->significand;
      }
      APInt::tcAssign(dst,&pSVar5->part,n);
    }
    if ((this->semantics->precision - 0x40 < 0xffffff80) &&
       ((this->significand).parts != (integerPart *)0x0)) {
      operator_delete__((this->significand).parts);
    }
    (this->significand).parts = dst;
  }
  else if ((uVar9 == 1) && (n != 1)) {
    bVar7 = this->field_0x12 & 7;
    if ((bVar7 == 1) || ((this->field_0x12 & 6) != 0 && bVar7 != 3)) {
      if (this->semantics->precision - 0x40 < 0xffffff80) {
        pSVar5 = (Significand *)(this->significand).parts;
      }
      else {
        pSVar5 = &this->significand;
      }
      SVar8 = *pSVar5;
    }
    else {
      SVar8.part = 0;
    }
    if ((this->semantics->precision - 0x40 < 0xffffff80) &&
       ((this->significand).parts != (integerPart *)0x0)) {
      operator_delete__((this->significand).parts);
    }
    (this->significand).part = (integerPart)SVar8;
  }
  this->semantics = toSemantics;
  if (0 < (int)Count) {
    bVar7 = this->field_0x12 & 7;
    if ((bVar7 == 1) || ((this->field_0x12 & 6) != 0 && bVar7 != 3)) {
      if (toSemantics->precision - 0x40 < 0xffffff80) {
        pSVar5 = (Significand *)(this->significand).parts;
      }
      else {
        pSVar5 = &this->significand;
      }
      APInt::tcShiftLeft(&pSVar5->part,uVar9,Count);
    }
  }
  bVar7 = this->field_0x12 & 7;
  if (bVar7 == 3 || (this->field_0x12 & 6) == 0) {
    if (bVar7 == 1) {
      *losesInfo = (bool)(lost_fraction != lfExactlyZero | bVar10);
      oVar4 = opOK;
      if (this->semantics == (fltSemantics *)semX87DoubleExtended && bVar10 == false) {
        uVar9 = this->semantics->precision;
        if (uVar9 - 0x40 < 0xffffff80) {
          pSVar5 = (Significand *)(this->significand).parts;
        }
        else {
          pSVar5 = &this->significand;
        }
        APInt::tcSetBit(&pSVar5->part,uVar9 - 1);
        oVar4 = opOK;
      }
    }
    else {
      *losesInfo = false;
      oVar4 = opOK;
    }
  }
  else {
    oVar4 = normalize(this,rounding_mode,lost_fraction);
    *losesInfo = oVar4 != opOK;
  }
  return oVar4;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::convert(const fltSemantics &toSemantics,
                                       roundingMode rounding_mode,
                                       bool *losesInfo) {
  lostFraction lostFraction;
  unsigned int newPartCount, oldPartCount;
  opStatus fs;
  int shift;
  const fltSemantics &fromSemantics = *semantics;

  lostFraction = lfExactlyZero;
  newPartCount = partCountForBits(toSemantics.precision + 1);
  oldPartCount = partCount();
  shift = toSemantics.precision - fromSemantics.precision;

  bool X86SpecialNan = false;
  if (&fromSemantics == &semX87DoubleExtended &&
      &toSemantics != &semX87DoubleExtended && category == fcNaN &&
      (!(*significandParts() & 0x8000000000000000ULL) ||
       !(*significandParts() & 0x4000000000000000ULL))) {
    // x86 has some unusual NaNs which cannot be represented in any other
    // format; note them here.
    X86SpecialNan = true;
  }

  // If this is a truncation of a denormal number, and the target semantics
  // has larger exponent range than the source semantics (this can happen
  // when truncating from PowerPC double-double to double format), the
  // right shift could lose result mantissa bits.  Adjust exponent instead
  // of performing excessive shift.
  if (shift < 0 && isFiniteNonZero()) {
    int exponentChange = significandMSB() + 1 - fromSemantics.precision;
    if (exponent + exponentChange < toSemantics.minExponent)
      exponentChange = toSemantics.minExponent - exponent;
    if (exponentChange < shift)
      exponentChange = shift;
    if (exponentChange < 0) {
      shift -= exponentChange;
      exponent += exponentChange;
    }
  }

  // If this is a truncation, perform the shift before we narrow the storage.
  if (shift < 0 && (isFiniteNonZero() || category==fcNaN))
    lostFraction = shiftRight(significandParts(), oldPartCount, -shift);

  // Fix the storage so it can hold to new value.
  if (newPartCount > oldPartCount) {
    // The new type requires more storage; make it available.
    integerPart *newParts;
    newParts = new integerPart[newPartCount];
    APInt::tcSet(newParts, 0, newPartCount);
    if (isFiniteNonZero() || category==fcNaN)
      APInt::tcAssign(newParts, significandParts(), oldPartCount);
    freeSignificand();
    significand.parts = newParts;
  } else if (newPartCount == 1 && oldPartCount != 1) {
    // Switch to built-in storage for a single part.
    integerPart newPart = 0;
    if (isFiniteNonZero() || category==fcNaN)
      newPart = significandParts()[0];
    freeSignificand();
    significand.part = newPart;
  }

  // Now that we have the right storage, switch the semantics.
  semantics = &toSemantics;

  // If this is an extension, perform the shift now that the storage is
  // available.
  if (shift > 0 && (isFiniteNonZero() || category==fcNaN))
    APInt::tcShiftLeft(significandParts(), newPartCount, shift);

  if (isFiniteNonZero()) {
    fs = normalize(rounding_mode, lostFraction);
    *losesInfo = (fs != opOK);
  } else if (category == fcNaN) {
    *losesInfo = lostFraction != lfExactlyZero || X86SpecialNan;

    // For x87 extended precision, we want to make a NaN, not a special NaN if
    // the input wasn't special either.
    if (!X86SpecialNan && semantics == &semX87DoubleExtended)
      APInt::tcSetBit(significandParts(), semantics->precision - 1);

    // gcc forces the Quiet bit on, which means (float)(double)(float_sNan)
    // does not give you back the same bits.  This is dubious, and we
    // don't currently do it.  You're really supposed to get
    // an invalid operation signal at runtime, but nobody does that.
    fs = opOK;
  } else {
    *losesInfo = false;
    fs = opOK;
  }

  return fs;
}